

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O2

unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
__thiscall
duckdb::TemporaryMemoryManager::Register(TemporaryMemoryManager *this,ClientContext *context)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __int_type _Var3;
  TemporaryMemoryState *this_00;
  ulong uVar4;
  type pTVar5;
  pointer pTVar6;
  ClientContext *in_RDX;
  ulong minimum_reservation_p;
  unique_lock<std::mutex> guard;
  value_type local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&guard,(mutex_type *)context);
  UpdateConfiguration((TemporaryMemoryManager *)context,in_RDX);
  this_00 = (TemporaryMemoryState *)operator_new(0x28);
  uVar4 = (long)(context->config).home_directory._M_dataplus._M_p << 0x1b;
  minimum_reservation_p =
       (ulong)(context->registered_state).
              super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl >> 4;
  if (uVar4 < minimum_reservation_p) {
    minimum_reservation_p = uVar4;
  }
  TemporaryMemoryState::TemporaryMemoryState
            (this_00,(TemporaryMemoryManager *)context,minimum_reservation_p);
  *(TemporaryMemoryState **)&(this->lock).super___mutex_base._M_mutex = this_00;
  pTVar5 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator*((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                        *)this);
  pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                         *)this);
  _Var3 = (pTVar6->minimum_reservation).super___atomic_base<unsigned_long>._M_i;
  p_Var1 = &(context->config).profiler_settings._M_h._M_before_begin;
  p_Var1->_M_nxt =
       (_Hash_node_base *)
       ((long)p_Var1->_M_nxt - (pTVar5->remaining_size).super___atomic_base<unsigned_long>._M_i);
  LOCK();
  (pTVar5->remaining_size).super___atomic_base<unsigned_long>._M_i = _Var3;
  UNLOCK();
  p_Var1 = &(context->config).profiler_settings._M_h._M_before_begin;
  p_Var1->_M_nxt =
       (_Hash_node_base *)
       ((long)&p_Var1->_M_nxt->_M_nxt +
       (pTVar5->remaining_size).super___atomic_base<unsigned_long>._M_i);
  pTVar5 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator*((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                        *)this);
  pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                         *)this);
  _Var3 = (pTVar6->minimum_reservation).super___atomic_base<unsigned_long>._M_i;
  psVar2 = &(context->config).profiler_settings._M_h._M_bucket_count;
  *psVar2 = *psVar2 - (pTVar5->reservation).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (pTVar5->reservation).super___atomic_base<unsigned_long>._M_i = _Var3;
  UNLOCK();
  psVar2 = &(context->config).profiler_settings._M_h._M_bucket_count;
  *psVar2 = *psVar2 + (pTVar5->reservation).super___atomic_base<unsigned_long>._M_i;
  local_20._M_data =
       unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
       ::operator*((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                    *)this);
  ::std::__detail::
  _Insert<std::reference_wrapper<duckdb::TemporaryMemoryState>,_std::reference_wrapper<duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<duckdb::TemporaryMemoryState>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::TemporaryMemoryState>,_duckdb::ReferenceHashFunction<duckdb::TemporaryMemoryState>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<std::reference_wrapper<duckdb::TemporaryMemoryState>,_std::reference_wrapper<duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<duckdb::TemporaryMemoryState>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::TemporaryMemoryState>,_duckdb::ReferenceHashFunction<duckdb::TemporaryMemoryState>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)((context->config).home_directory.field_2._M_local_buf + 8),&local_20);
  ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  return (unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
          )(unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
            )this;
}

Assistant:

unique_ptr<TemporaryMemoryState> TemporaryMemoryManager::Register(ClientContext &context) {
	auto guard = Lock();
	UpdateConfiguration(context);

	auto result = unique_ptr<TemporaryMemoryState>(new TemporaryMemoryState(*this, DefaultMinimumReservation()));
	SetRemainingSize(*result, result->GetMinimumReservation());
	SetReservation(*result, result->GetMinimumReservation());
	active_states.insert(*result);

	Verify();
	return result;
}